

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_package.c
# Opt level: O2

int lj_cf_package_loader_preload(lua_State *L)

{
  int iVar1;
  char *k;
  char *pcVar2;
  
  k = luaL_checklstring(L,1,(size_t *)0x0);
  lua_getfield(L,-0x2711,"preload");
  iVar1 = lua_type(L,-1);
  if (iVar1 != 5) {
    luaL_error(L,"\'package.preload\' must be a table");
  }
  lua_getfield(L,-1,k);
  iVar1 = lua_type(L,-1);
  if (iVar1 == 0) {
    pcVar2 = mksymname(L,k,"luaJIT_BC_%s");
    pcVar2 = (char *)dlsym(0,pcVar2);
    if ((pcVar2 != (char *)0x0) &&
       (iVar1 = luaL_loadbuffer(L,pcVar2,0xffffffffffffffff,k), iVar1 == 0)) {
      return 1;
    }
    lua_pushfstring(L,"\n\tno field package.preload[\'%s\']",k);
  }
  return 1;
}

Assistant:

static int lj_cf_package_loader_preload(lua_State *L)
{
  const char *name = luaL_checkstring(L, 1);
  lua_getfield(L, LUA_ENVIRONINDEX, "preload");
  if (!lua_istable(L, -1))
    luaL_error(L, LUA_QL("package.preload") " must be a table");
  lua_getfield(L, -1, name);
  if (lua_isnil(L, -1)) {  /* Not found? */
    const char *bcname = mksymname(L, name, SYMPREFIX_BC);
    const char *bcdata = ll_bcsym(NULL, bcname);
    if (bcdata == NULL || luaL_loadbuffer(L, bcdata, ~(size_t)0, name) != 0)
      lua_pushfstring(L, "\n\tno field package.preload['%s']", name);
  }
  return 1;
}